

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O2

void __thiscall OpenMD::Perturbations::Light::modifyForces(Light *this)

{
  uint uVar1;
  pointer pcVar2;
  long lVar3;
  Snapshot *this_00;
  bool bVar4;
  bool bVar5;
  Molecule *pMVar6;
  pointer ppAVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  AtomType *pAVar11;
  Atom *this_01;
  double dVar12;
  double local_300;
  double local_2f8;
  FixedChargeAdapter fca;
  MoleculeIterator i;
  Vector<double,_3U> local_2d8;
  Vector3d *local_2c0;
  RotMat3x3d *local_2b8;
  RotMat3x3d *local_2b0;
  RealType local_2a8;
  Molecule *local_2a0;
  AtomType *local_298;
  pointer local_290;
  MultipoleAdapter ma;
  FluctuatingChargeAdapter fqa;
  Vector3d EF;
  Vector3d av;
  Vector3d BF;
  Vector3d EFk;
  Vector3d J;
  complex<double> argument;
  Vector3d D;
  Vector3d v;
  Vector3d r;
  Vector<double,_3U> local_1a8;
  Vector3d f;
  Vector3d rp;
  Vector3<double> local_160;
  Vector3d trq;
  Mat3x3d I;
  RectMatrix<double,_3U,_3U> local_e8;
  potVec longRangePotential;
  Vector<double,_7U> local_68;
  
  if (this->initialized == false) {
    initialize(this);
  }
  i._M_node = (_Base_ptr)0x0;
  I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  Vector<double,_7U>::Vector(&longRangePotential,(double *)&I);
  Vector<double,_3U>::Vector(&r.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rp.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&v.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&f.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&trq.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&D.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&J.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&av.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&EFk.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&EF.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&BF.super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&I.super_SquareMatrix<double,_3>);
  if (this->doLight == true) {
    local_2a8 = Snapshot::getTime(this->info_->sman_->currentSnapshot_);
    pMVar6 = SimInfo::beginMolecule(this->info_,&i);
    local_2b0 = &this->A_;
    local_2b8 = &this->Ainv_;
    local_2c0 = &this->khat_;
    local_300 = 0.0;
    while (pMVar6 != (Molecule *)0x0) {
      ppAVar7 = (pMVar6->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_2a0 = pMVar6;
      if (ppAVar7 !=
          (pMVar6->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_001fa795;
      this_01 = (Atom *)0x0;
      while( true ) {
        if (this_01 == (Atom *)0x0) break;
        pAVar11 = this_01->atomType_;
        local_290 = ppAVar7;
        StuntDouble::getPos((Vector3d *)&local_e8,&this_01->super_StuntDouble);
        Vector<double,_3U>::operator=(&r.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_e8);
        StuntDouble::getVel((Vector3d *)&local_e8,&this_01->super_StuntDouble);
        Vector<double,_3U>::operator=(&v.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_e8);
        operator*((Vector<double,_3U> *)&local_e8,(RectMatrix<double,_3U,_3U> *)local_2b0,
                  &r.super_Vector<double,_3U>);
        Vector3<double>::operator=(&rp,(Vector<double,_3U> *)&local_e8);
        argument._M_value._0_8_ = 0;
        argument._M_value._8_8_ =
             this->kmag_ * rp.super_Vector<double,_3U>.data_[2] - this->omega_ * local_2a8;
        pcVar2 = (this->jones_).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar12 = *(double *)pcVar2->_M_value;
        local_e8.data_[0][0] = this->E0_ * dVar12;
        local_e8.data_[0][1] = this->E0_ * *(double *)(pcVar2->_M_value + 8);
        std::exp<double>(&argument);
        local_2d8.data_[1] = dVar12;
        std::operator*((complex<double> *)&local_e8,(complex<double> *)&local_2d8);
        pcVar2 = (this->jones_).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar12 = *(double *)pcVar2[1]._M_value;
        local_e8.data_[0][0] = this->E0_ * dVar12;
        local_e8.data_[0][1] = this->E0_ * *(double *)(pcVar2[1]._M_value + 8);
        std::exp<double>(&argument);
        local_2d8.data_[1] = dVar12;
        std::operator*((complex<double> *)&local_e8,(complex<double> *)&local_2d8);
        EFk.super_Vector<double,_3U>.data_[2] = 0.0;
        operator*((Vector<double,_3U> *)&local_e8,(RectMatrix<double,_3U,_3U> *)local_2b8,
                  &EFk.super_Vector<double,_3U>);
        Vector3<double>::operator=(&EF,(Vector<double,_3U> *)&local_e8);
        cross<double>((Vector3<double> *)&local_2d8,&EF,local_2c0);
        operator/((Vector<double,_3U> *)&local_e8,&local_2d8,2997.9245800000003);
        Vector3<double>::operator=(&BF,(Vector<double,_3U> *)&local_e8);
        StuntDouble::addElectricField(&this_01->super_StuntDouble,&EF);
        fca.at_ = pAVar11;
        bVar4 = FixedChargeAdapter::isFixedCharge(&fca);
        local_2f8 = 0.0;
        if (bVar4) {
          local_2f8 = FixedChargeAdapter::getCharge(&fca);
        }
        fqa.at_ = pAVar11;
        bVar5 = FluctuatingChargeAdapter::isFluctuatingCharge(&fqa);
        if (bVar5) {
          local_2f8 = local_2f8 +
                      *(double *)
                       (*(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->
                                          currentSnapshot_->atomData).flucQPos.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start +
                                 (this_01->super_StuntDouble).storage_) +
                       (long)(this_01->super_StuntDouble).localIndex_ * 8);
          dVar12 = dot<double,3u>(&r.super_Vector<double,_3U>,&EF.super_Vector<double,_3U>);
          lVar8 = (long)(this_01->super_StuntDouble).localIndex_;
          lVar3 = *(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).flucQFrc.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start +
                           (this_01->super_StuntDouble).storage_);
          *(double *)(lVar3 + lVar8 * 8) = dVar12 + *(double *)(lVar3 + lVar8 * 8);
LAB_001fa462:
          local_298 = pAVar11;
          cross<double>((Vector3<double> *)&local_1a8,&v,&BF);
          OpenMD::operator+(&local_2d8,&EF.super_Vector<double,_3U>,&local_1a8);
          operator*((Vector<double,_3U> *)&local_e8,local_2f8,&local_2d8);
          Vector3<double>::operator=
                    ((Vector3<double> *)&f.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_e8)
          ;
          StuntDouble::addFrc(&this_01->super_StuntDouble,(Vector3d *)&f.super_Vector<double,_3U>);
          dVar12 = dot<double,3u>(&r.super_Vector<double,_3U>,&f.super_Vector<double,_3U>);
          if (this->doParticlePot == true) {
            lVar8 = (long)(this_01->super_StuntDouble).localIndex_;
            lVar3 = *(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).particlePot.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (this_01->super_StuntDouble).storage_);
            *(double *)(lVar3 + lVar8 * 8) = *(double *)(lVar3 + lVar8 * 8) - dVar12;
          }
          local_300 = local_300 - dVar12;
          pAVar11 = local_298;
        }
        else if (bVar4) goto LAB_001fa462;
        ma.at_ = pAVar11;
        bVar4 = MultipoleAdapter::isDipole(&ma);
        if (bVar4) {
          StuntDouble::getDipole((Vector3d *)&local_2d8,&this_01->super_StuntDouble);
          operator*((Vector<double,_3U> *)&local_e8,&local_2d8,0.2081943);
          Vector3<double>::operator=(&D,(Vector<double,_3U> *)&local_e8);
          cross<double>((Vector3<double> *)&local_2d8,&D,&EF);
          cross<double>(&local_160,&v,&BF);
          cross<double>((Vector3<double> *)&local_1a8,&D,&local_160);
          OpenMD::operator+((Vector<double,_3U> *)&local_e8,&local_2d8,&local_1a8);
          Vector<double,_3U>::add(&trq.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_e8);
          StuntDouble::addTrq(&this_01->super_StuntDouble,(Vector3d *)&trq.super_Vector<double,_3U>)
          ;
          StuntDouble::getJ((Vector3d *)&local_e8,&this_01->super_StuntDouble);
          Vector<double,_3U>::operator=(&J.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_e8)
          ;
          (*(this_01->super_StuntDouble)._vptr_StuntDouble[5])(&local_e8,this_01);
          RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&I,&local_e8);
          if ((this_01->super_StuntDouble).linear_ == true) {
            uVar1 = (this_01->super_StuntDouble).linearAxis_;
            uVar9 = (long)(int)(uVar1 + 1) % 3 & 0xffffffff;
            uVar10 = (long)(int)(uVar1 + 2) % 3 & 0xffffffff;
            av.super_Vector<double,_3U>.data_[uVar1] = 0.0;
            av.super_Vector<double,_3U>.data_[uVar9] =
                 J.super_Vector<double,_3U>.data_[uVar9] /
                 *(double *)
                  ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                  uVar9 * 0x20);
            av.super_Vector<double,_3U>.data_[uVar10] =
                 J.super_Vector<double,_3U>.data_[uVar10] /
                 *(double *)
                  ((long)I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
                  uVar10 * 0x20);
          }
          else {
            SquareMatrix3<double>::inverse
                      ((SquareMatrix3<double> *)&local_e8,(SquareMatrix3<double> *)&I);
            operator*(&local_2d8,&local_e8,&J.super_Vector<double,_3U>);
            Vector3<double>::operator=(&av,&local_2d8);
          }
          cross<double>((Vector3<double> *)&local_2d8,&av,
                        (Vector3<double> *)&D.super_Vector<double,_3U>);
          cross<double>((Vector3<double> *)&local_e8,(Vector3<double> *)&local_2d8,&BF);
          Vector<double,_3U>::operator=(&f.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_e8)
          ;
          StuntDouble::addFrc(&this_01->super_StuntDouble,(Vector3d *)&f.super_Vector<double,_3U>);
          dVar12 = dot<double,3u>(&D.super_Vector<double,_3U>,&EF.super_Vector<double,_3U>);
          if (this->doParticlePot == true) {
            lVar8 = (long)(this_01->super_StuntDouble).localIndex_;
            lVar3 = *(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).particlePot.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (this_01->super_StuntDouble).storage_);
            *(double *)(lVar3 + lVar8 * 8) = *(double *)(lVar3 + lVar8 * 8) - dVar12;
          }
          local_300 = local_300 - dVar12;
        }
        ppAVar7 = local_290 + 1;
        this_01 = (Atom *)0x0;
        if (ppAVar7 !=
            (local_2a0->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_001fa795:
          this_01 = *ppAVar7;
        }
      }
      pMVar6 = SimInfo::nextMolecule(this->info_,&i);
    }
    this_00 = this->info_->sman_->currentSnapshot_;
    Snapshot::getLongRangePotentials((potVec *)&local_e8,this_00);
    Vector<double,_7U>::operator=(&longRangePotential,(Vector<double,_7U> *)&local_e8);
    longRangePotential.data_[2] = local_300 + longRangePotential.data_[2];
    Vector<double,_7U>::Vector(&local_68,&longRangePotential);
    Snapshot::setLongRangePotentials(this_00,&local_68);
  }
  return;
}

Assistant:

void Light::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);
    int l, m, n;
    RealType C {}, U {}, fPot {};
    Vector3d r {}, rp {}, v {}, f {}, trq {}, D {}, J {}, av {};
    Vector3d EFk {}, EF {}, BF {};
    Mat3x3d I {};

    bool isCharge;

    if (doLight) {
      RealType t = info_->getSnapshotManager()->getCurrentSnapshot()->getTime();
      U          = 0.0;
      fPot       = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          // We are not wrapping coordinates for light interactions:
          r = atom->getPos();
          v = atom->getVel();

          rp = A_ * r;  // atom's position in frame of light propagation

          // e^{ i (k*z - omega * t) } is the main oscillatory component:
          std::complex<RealType> argument(0.0, kmag_ * rp.z() - omega_ * t);
          std::complex<RealType> Ex = E0_ * jones_[0] * std::exp(argument);
          std::complex<RealType> Ey = E0_ * jones_[1] * std::exp(argument);

          EFk.x() = Ex.real();
          EFk.y() = Ey.real();
          EFk.z() = 0.0;

          EF = Ainv_ * EFk;  // electric field rotated back into lab coordinates

          // The magnetic field (BF) is perpendicular to both electric field
          // and light propagation direction:

          BF = cross(EF, khat_) / Constants::c;

          atom->addElectricField(EF);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF));
          }

          if (isCharge) {
            f = C * (EF + cross(v, BF));
            atom->addFrc(f);
            U = -dot(r, f);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleConvert;

            trq += cross(D, EF) + cross(D, cross(v, BF));

            atom->addTrq(trq);

            J = atom->getJ();
            I = atom->getI();
            if (atom->isLinear()) {
              l     = atom->linearAxis();
              m     = (l + 1) % 3;
              n     = (l + 2) % 3;
              av[l] = 0;
              av[m] = J[m] / I(m, m);
              av[n] = J[n] / I(n, n);
            } else {
              av = I.inverse() * J;
            }

            f = cross(cross(av, D), BF);
            atom->addFrc(f);

            U = -dot(D, EF);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }